

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

VP8LHistogramSet * VP8LAllocateHistogramSet(int size,int cache_bits)

{
  VP8LHistogram *pVVar1;
  int iVar2;
  VP8LHistogramSet *set;
  ulong uVar3;
  
  iVar2 = (4 << ((byte)cache_bits & 0x1f)) + 0x1138;
  if (cache_bits < 1) {
    iVar2 = 0x1138;
  }
  set = (VP8LHistogramSet *)WebPSafeMalloc(((long)iVar2 + 0x27) * (long)size + 0x10,1);
  if (set != (VP8LHistogramSet *)0x0) {
    set->histograms = (VP8LHistogram **)(set + 1);
    set->max_size = size;
    set->size = size;
    HistogramSetResetPointers(set,cache_bits);
    if (0 < size) {
      uVar3 = 0;
      do {
        pVVar1 = set->histograms[uVar3];
        pVVar1->palette_code_bits_ = cache_bits;
        *(undefined8 *)&pVVar1->trivial_symbol_ = 0;
        *(undefined8 *)((long)&pVVar1->bit_cost_ + 4) = 0;
        *(undefined8 *)((long)&pVVar1->literal_cost_ + 4) = 0;
        *(undefined8 *)((long)&pVVar1->red_cost_ + 4) = 0;
        *(undefined8 *)((long)&pVVar1->red_cost_ + 5) = 0;
        *(undefined8 *)((long)&pVVar1->blue_cost_ + 5) = 0;
        uVar3 = uVar3 + 1;
      } while ((uint)size != uVar3);
    }
  }
  return set;
}

Assistant:

VP8LHistogramSet* VP8LAllocateHistogramSet(int size, int cache_bits) {
  int i;
  VP8LHistogramSet* set;
  const size_t total_size = HistogramSetTotalSize(size, cache_bits);
  uint8_t* memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;

  set = (VP8LHistogramSet*)memory;
  memory += sizeof(*set);
  set->histograms = (VP8LHistogram**)memory;
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set, cache_bits);
  for (i = 0; i < size; ++i) {
    VP8LHistogramInit(set->histograms[i], cache_bits, /*init_arrays=*/ 0);
  }
  return set;
}